

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_double_fast.c
# Opt level: O2

void ZSTD_fillDoubleHashTable(ZSTD_matchState_t *ms,void *end,ZSTD_dictTableLoadMethod_e dtlm)

{
  U32 mls;
  U32 hBits;
  uint uVar1;
  U32 *pUVar2;
  U32 *pUVar3;
  BYTE *pBVar4;
  size_t sVar5;
  BYTE *p;
  long lVar6;
  ulong uVar7;
  ulong local_60;
  int local_58;
  
  pUVar2 = ms->hashTable;
  mls = (ms->cParams).minMatch;
  pUVar3 = ms->chainTable;
  hBits = (ms->cParams).chainLog;
  pBVar4 = (ms->window).base;
  local_60 = (ulong)ms->nextToUpdate;
  uVar1 = (ms->cParams).hashLog;
  p = pBVar4 + local_60;
  do {
    if ((BYTE *)((long)end - 8U) < p + 2) {
      return;
    }
    local_58 = (int)pBVar4;
    lVar6 = 0;
    do {
      if (lVar6 == 3) break;
      uVar7 = (ulong)(*(long *)(p + lVar6) * -0x30e44323485a9b9d) >> (0x40U - (char)uVar1 & 0x3f);
      if (lVar6 == 0) {
        sVar5 = ZSTD_hashPtr(p,hBits,mls);
        pUVar3[sVar5] = (int)p - local_58;
LAB_0036f90b:
        pUVar2[uVar7] = (int)local_60 + (int)lVar6;
      }
      else if (pUVar2[uVar7] == 0) goto LAB_0036f90b;
      lVar6 = lVar6 + 1;
    } while (dtlm != ZSTD_dtlm_fast);
    local_60 = local_60 + 3;
    p = p + 3;
  } while( true );
}

Assistant:

void ZSTD_fillDoubleHashTable(ZSTD_matchState_t* ms,
                              void const* end, ZSTD_dictTableLoadMethod_e dtlm)
{
    const ZSTD_compressionParameters* const cParams = &ms->cParams;
    U32* const hashLarge = ms->hashTable;
    U32  const hBitsL = cParams->hashLog;
    U32  const mls = cParams->minMatch;
    U32* const hashSmall = ms->chainTable;
    U32  const hBitsS = cParams->chainLog;
    const BYTE* const base = ms->window.base;
    const BYTE* ip = base + ms->nextToUpdate;
    const BYTE* const iend = ((const BYTE*)end) - HASH_READ_SIZE;
    const U32 fastHashFillStep = 3;

    /* Always insert every fastHashFillStep position into the hash tables.
     * Insert the other positions into the large hash table if their entry
     * is empty.
     */
    for (; ip + fastHashFillStep - 1 <= iend; ip += fastHashFillStep) {
        U32 const current = (U32)(ip - base);
        U32 i;
        for (i = 0; i < fastHashFillStep; ++i) {
            size_t const smHash = ZSTD_hashPtr(ip + i, hBitsS, mls);
            size_t const lgHash = ZSTD_hashPtr(ip + i, hBitsL, 8);
            if (i == 0)
                hashSmall[smHash] = current + i;
            if (i == 0 || hashLarge[lgHash] == 0)
                hashLarge[lgHash] = current + i;
            /* Only load extra positions for ZSTD_dtlm_full */
            if (dtlm == ZSTD_dtlm_fast)
                break;
        }
    }
}